

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall imrt::Collimator::printAxisValues(Collimator *this)

{
  ostream *poVar1;
  pointer pdVar2;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x:",2);
  pdVar2 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    uVar3 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(pdVar2[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
      uVar3 = uVar3 + 1;
      pdVar2 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->xcoord).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y:",2);
  pdVar2 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    uVar3 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(pdVar2[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
      uVar3 = uVar3 + 1;
      pdVar2 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->ycoord).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return;
}

Assistant:

void Collimator::printAxisValues() {
    cout << "x:";
    for (int i=0;i<xcoord.size(); i++ )
      cout << xcoord[i] << ",";
    cout << endl;
    cout << "y:";
    for (int i=0;i<ycoord.size(); i++ )
      cout << ycoord[i] << ",";
    cout << endl;
  }